

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu.cpp
# Opt level: O0

blargg_err_t __thiscall Vgm_Emu::track_info_(Vgm_Emu *this,track_info_t *out,int param_3)

{
  byte_ *in;
  undefined4 in_EDX;
  header_t *in_RSI;
  Vgm_Emu *in_RDI;
  byte_ *gd3;
  int size;
  undefined4 in_stack_ffffffffffffffe8;
  Vgm_Emu *this_00;
  
  this_00 = in_RDI;
  header(in_RDI);
  get_vgm_length(in_RSI,(track_info_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  in = gd3_data(this_00,(int *)in_RSI);
  if (in != (byte_ *)0x0) {
    parse_gd3(in,(byte_ *)in_RDI,(track_info_t *)0x80ae48);
  }
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t Vgm_Emu::track_info_( track_info_t* out, int ) const
{
	get_vgm_length( header(), out );
	
	int size;
	byte const* gd3 = gd3_data( &size );
	if ( gd3 )
		parse_gd3( gd3 + gd3_header_size, gd3 + size, out );
	
	return 0;
}